

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quad_demo.cc
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  quadDegree_t qVar2;
  initializer_list<unsigned_int> __l;
  initializer_list<unsigned_int> __l_00;
  initializer_list<unsigned_int> __l_01;
  pointer argv_00;
  options_description_easy_init *poVar3;
  typed_value<int,_char> *ptVar4;
  size_type sVar5;
  ostream *poVar6;
  variable_value *pvVar7;
  int *piVar8;
  quadDegree_t *pqVar9;
  CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *pCVar10;
  element_type *mesh_00;
  Scalar *pSVar11;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  BDCSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> local_d80;
  Solve<Eigen::SVDBase<Eigen::BDCSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
  local_c88;
  undefined1 local_c78 [8];
  VectorXd x;
  Type local_c30;
  non_const_type local_bf8;
  NestedExpressionType local_bf0;
  ArrayBase<Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
  local_be8 [16];
  MatrixWrapper<const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_log_op<double>,_const_Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>_>
  local_bd8;
  undefined1 local_bc8 [8];
  VectorXd b;
  __type_conflict local_b80;
  double local_b78;
  Scalar local_b70;
  RandomAccessLinSpacedReturnType local_b68;
  NegativeReturnType local_b30;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::linspaced_op<double>,_Eigen::Array<double,__1,_1,_0,__1,_1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,__1,_1,_0,__1,_1>_>_>
  local_ae8;
  MatrixWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::linspaced_op<double>,_Eigen::Array<double,__1,_1,_0,__1,_1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,__1,_1,_0,__1,_1>_>_>_>
  local_a78;
  ColXpr local_a08;
  int local_9d0;
  int local_9cc;
  undefined1 local_9c8 [8];
  MatrixXd A;
  unique_ptr<lf::mesh::hybrid2d::MeshFactory,_std::default_delete<lf::mesh::hybrid2d::MeshFactory>_>
  local_998;
  unique_ptr<lf::mesh::MeshFactory,_std::default_delete<lf::mesh::MeshFactory>_> local_990;
  undefined1 local_988 [8];
  MeshHierarchy mh;
  double approx;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_880;
  shared_ptr<const_lf::mesh::Mesh> local_860;
  undefined1 local_850 [8];
  VtkWriter vtk_writer;
  int level;
  VectorXd errors;
  shared_ptr<lf::mesh::Mesh> mesh;
  double exact_integral;
  anon_class_8_1_3fcf66b7 f;
  type pi;
  shared_ptr<lf::mesh::Mesh> base_mesh;
  unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_> local_620;
  allocator<unsigned_int> local_611;
  pair<std::array<unsigned_int,_2UL>,_std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>_>
  local_610;
  pair<std::array<unsigned_int,_2UL>,_std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>_>
  *local_600;
  pointer local_5f8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_5f0;
  span<const_unsigned_int,_18446744073709551615UL> local_5d8;
  RefEl local_5c1;
  Scalar local_5c0;
  Scalar local_5b8;
  Scalar local_5b0;
  Scalar local_5a8;
  Scalar local_5a0;
  Scalar local_598;
  Scalar local_590;
  Scalar local_588;
  CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> local_580;
  int local_560 [2];
  Matrix<double,__1,__1,_0,__1,__1> local_558;
  undefined1 local_540 [8];
  unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_> local_538;
  allocator<unsigned_int> local_52d;
  uint local_52c [3];
  iterator local_520;
  size_type local_518;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_510;
  span<const_unsigned_int,_18446744073709551615UL> local_4f8;
  RefEl local_4e1;
  Scalar local_4e0;
  Scalar local_4d8;
  Scalar local_4d0;
  Scalar local_4c8;
  Scalar local_4c0;
  Scalar local_4b8;
  CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> local_4b0;
  undefined1 local_490 [8];
  unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_> local_488;
  allocator<unsigned_int> local_47d;
  uint local_47c [3];
  iterator local_470;
  size_type local_468;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_460;
  span<const_unsigned_int,_18446744073709551615UL> local_448;
  RefEl local_431;
  Scalar local_430;
  Scalar local_428;
  Scalar local_420;
  Scalar local_418;
  Scalar local_410;
  Scalar local_408;
  CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> local_400;
  int local_3e0 [2];
  undefined1 local_3d8 [8];
  MatrixXd node_coords;
  Matrix<double,2,1,0,2,1> local_3b8 [16];
  coord_t local_3a8;
  int local_394;
  double local_390;
  Matrix<double,2,1,0,2,1> local_388 [24];
  coord_t local_370;
  int local_360 [2];
  Matrix<double,2,1,0,2,1> local_358 [24];
  coord_t local_340;
  int local_330 [2];
  Matrix<double,2,1,0,2,1> local_328 [16];
  coord_t local_318;
  int local_304;
  double local_300;
  Matrix<double,2,1,0,2,1> local_2f8 [24];
  coord_t local_2e0;
  int local_2d0 [2];
  Matrix<double,2,1,0,2,1> local_2c8 [16];
  coord_t local_2b8;
  undefined1 local_2a8 [8];
  MeshFactory mesh_factory;
  string local_240;
  quadDegree_t local_220;
  allocator<char> local_219;
  int quad_degree;
  int local_1f4;
  undefined4 local_1f0;
  int max_level;
  key_type local_1e8;
  function_n<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_1c8;
  basic_parsed_options<char> local_1a8;
  undefined1 local_180 [8];
  variables_map vm;
  options_description_easy_init local_d8 [3];
  allocator<char> local_b9;
  string local_b8;
  undefined1 local_98 [8];
  options_description desc;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  desc.groups.
  super__Vector_base<boost::shared_ptr<boost::program_options::options_description>,_std::allocator<boost::shared_ptr<boost::program_options::options_description>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)argv;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b8,"Allowed options",&local_b9);
  boost::program_options::options_description::options_description
            ((options_description *)local_98,&local_b8,0x50,0x28);
  std::__cxx11::string::~string((string *)&local_b8);
  std::allocator<char>::~allocator(&local_b9);
  local_d8[0] = boost::program_options::options_description::add_options
                          ((options_description *)local_98);
  poVar3 = boost::program_options::options_description_easy_init::operator()
                     (local_d8,"help","produce this help message");
  ptVar4 = boost::program_options::value<int>();
  vm.m_required._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = 3;
  ptVar4 = boost::program_options::typed_value<int,_char>::default_value
                     (ptVar4,(int *)((long)&vm.m_required._M_t._M_impl.super__Rb_tree_header.
                                            _M_node_count + 4));
  poVar3 = boost::program_options::options_description_easy_init::operator()
                     (poVar3,"quad_degree",(value_semantic *)ptVar4,
                      "The degree of the local quadrature rule.");
  ptVar4 = boost::program_options::value<int>();
  vm.m_required._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ = 5;
  ptVar4 = boost::program_options::typed_value<int,_char>::default_value
                     (ptVar4,(int *)&vm.m_required._M_t._M_impl.super__Rb_tree_header._M_node_count)
  ;
  boost::program_options::options_description_easy_init::operator()
            (poVar3,"max_level",(value_semantic *)ptVar4,"The number of refinement levels");
  boost::program_options::variables_map::variables_map((variables_map *)local_180);
  argv_00 = desc.groups.
            super__Vector_base<boost::shared_ptr<boost::program_options::options_description>,_std::allocator<boost::shared_ptr<boost::program_options::options_description>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_1c8.super_function_base.functor._8_8_ = 0;
  local_1c8.super_function_base.functor._16_8_ = 0;
  local_1c8.super_function_base.vtable = (vtable_base *)0x0;
  local_1c8.super_function_base.functor.members.obj_ptr = (obj_ptr_t)0x0;
  boost::
  function_n<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::function_n(&local_1c8);
  boost::program_options::parse_command_line<char>
            (&local_1a8,argc,(char **)argv_00,(options_description *)local_98,0,&local_1c8);
  boost::program_options::store(&local_1a8,(variables_map *)local_180,false);
  boost::program_options::basic_parsed_options<char>::~basic_parsed_options(&local_1a8);
  boost::
  function_n<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::~function_n(&local_1c8);
  boost::program_options::notify((variables_map *)local_180);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1e8,"help",(allocator<char> *)((long)&max_level + 3));
  sVar5 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
          ::count((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                   *)&vm.super_abstract_variables_map.m_next,&local_1e8);
  std::__cxx11::string::~string((string *)&local_1e8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&max_level + 3));
  if (sVar5 == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&quad_degree,"max_level",&local_219);
    pvVar7 = boost::program_options::variables_map::operator[]
                       ((variables_map *)local_180,(string *)&quad_degree);
    piVar8 = boost::program_options::variable_value::as<int>(pvVar7);
    iVar1 = *piVar8;
    std::__cxx11::string::~string((string *)&quad_degree);
    std::allocator<char>::~allocator(&local_219);
    local_1f4 = iVar1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_240,"quad_degree",(allocator<char> *)&mesh_factory.field_0x5f);
    pvVar7 = boost::program_options::variables_map::operator[]
                       ((variables_map *)local_180,&local_240);
    pqVar9 = (quadDegree_t *)boost::program_options::variable_value::as<int>(pvVar7);
    qVar2 = *pqVar9;
    std::__cxx11::string::~string((string *)&local_240);
    std::allocator<char>::~allocator((allocator<char> *)&mesh_factory.field_0x5f);
    local_220 = qVar2;
    lf::mesh::hybrid2d::MeshFactory::MeshFactory((MeshFactory *)local_2a8,2,true);
    local_2d0[1] = 0;
    local_2d0[0] = 0;
    Eigen::Matrix<double,2,1,0,2,1>::Matrix<int,int>(local_2c8,local_2d0 + 1,local_2d0);
    Eigen::Matrix<double,-1,1,0,-1,1>::Matrix<Eigen::Matrix<double,2,1,0,2,1>>
              ((Matrix<double,_1,1,0,_1,1> *)&local_2b8,
               (EigenBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> *)local_2c8);
    lf::mesh::hybrid2d::MeshFactory::AddPoint((MeshFactory *)local_2a8,&local_2b8);
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix(&local_2b8);
    local_300 = 0.5;
    local_304 = 0;
    Eigen::Matrix<double,2,1,0,2,1>::Matrix<double,int>(local_2f8,&local_300,&local_304);
    Eigen::Matrix<double,-1,1,0,-1,1>::Matrix<Eigen::Matrix<double,2,1,0,2,1>>
              ((Matrix<double,_1,1,0,_1,1> *)&local_2e0,
               (EigenBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> *)local_2f8);
    lf::mesh::hybrid2d::MeshFactory::AddPoint((MeshFactory *)local_2a8,&local_2e0);
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix(&local_2e0);
    local_330[1] = 1;
    local_330[0] = 0;
    Eigen::Matrix<double,2,1,0,2,1>::Matrix<int,int>(local_328,local_330 + 1,local_330);
    Eigen::Matrix<double,-1,1,0,-1,1>::Matrix<Eigen::Matrix<double,2,1,0,2,1>>
              ((Matrix<double,_1,1,0,_1,1> *)&local_318,
               (EigenBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> *)local_328);
    lf::mesh::hybrid2d::MeshFactory::AddPoint((MeshFactory *)local_2a8,&local_318);
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix(&local_318);
    local_360[1] = 1;
    local_360[0] = 1;
    Eigen::Matrix<double,2,1,0,2,1>::Matrix<int,int>(local_358,local_360 + 1,local_360);
    Eigen::Matrix<double,-1,1,0,-1,1>::Matrix<Eigen::Matrix<double,2,1,0,2,1>>
              ((Matrix<double,_1,1,0,_1,1> *)&local_340,
               (EigenBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> *)local_358);
    lf::mesh::hybrid2d::MeshFactory::AddPoint((MeshFactory *)local_2a8,&local_340);
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix(&local_340);
    local_390 = 0.5;
    local_394 = 1;
    Eigen::Matrix<double,2,1,0,2,1>::Matrix<double,int>(local_388,&local_390,&local_394);
    Eigen::Matrix<double,-1,1,0,-1,1>::Matrix<Eigen::Matrix<double,2,1,0,2,1>>
              ((Matrix<double,_1,1,0,_1,1> *)&local_370,
               (EigenBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> *)local_388);
    lf::mesh::hybrid2d::MeshFactory::AddPoint((MeshFactory *)local_2a8,&local_370);
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix(&local_370);
    node_coords.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols.
    _4_4_ = 0;
    node_coords.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols.
    _0_4_ = 1;
    Eigen::Matrix<double,2,1,0,2,1>::Matrix<int,int>
              (local_3b8,
               (int *)((long)&node_coords.
                              super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                              m_storage.m_cols + 4),
               (int *)&node_coords.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                       m_storage.m_cols);
    Eigen::Matrix<double,-1,1,0,-1,1>::Matrix<Eigen::Matrix<double,2,1,0,2,1>>
              ((Matrix<double,_1,1,0,_1,1> *)&local_3a8,
               (EigenBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> *)local_3b8);
    lf::mesh::hybrid2d::MeshFactory::AddPoint((MeshFactory *)local_2a8,&local_3a8);
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix(&local_3a8);
    local_3e0[1] = 2;
    local_3e0[0] = 3;
    Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<int,int>
              ((Matrix<double,_1,_1,0,_1,_1> *)local_3d8,local_3e0 + 1,local_3e0);
    local_408 = 0.0;
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator<<
              (&local_400,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_3d8,
               &local_408);
    local_410 = 0.5;
    pCVar10 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                        (&local_400,&local_410);
    local_418 = 0.5;
    pCVar10 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                        (pCVar10,&local_418);
    local_420 = 0.0;
    pCVar10 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                        (pCVar10,&local_420);
    local_428 = 0.0;
    pCVar10 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                        (pCVar10,&local_428);
    local_430 = 1.0;
    Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
              (pCVar10,&local_430);
    Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::~CommaInitializer
              (&local_400);
    local_431 = lf::base::RefEl::kTria();
    local_47c[0] = 0;
    local_47c[1] = 1;
    local_47c[2] = 4;
    local_470 = local_47c;
    local_468 = 3;
    std::allocator<unsigned_int>::allocator(&local_47d);
    __l_01._M_len = local_468;
    __l_01._M_array = local_470;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_460,__l_01,&local_47d);
    std::span<const_unsigned_int,_18446744073709551615UL>::
    span<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>(&local_448,&local_460);
    std::make_unique<lf::geometry::TriaO1,Eigen::Matrix<double,_1,_1,0,_1,_1>&>
              ((Matrix<double,__1,__1,_0,__1,__1> *)local_490);
    std::unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>::
    unique_ptr<lf::geometry::TriaO1,std::default_delete<lf::geometry::TriaO1>,void>
              ((unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>> *)
               &local_488,
               (unique_ptr<lf::geometry::TriaO1,_std::default_delete<lf::geometry::TriaO1>_> *)
               local_490);
    lf::mesh::hybrid2d::MeshFactory::AddEntity
              ((MeshFactory *)local_2a8,local_431,&local_448,&local_488);
    std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>::
    ~unique_ptr(&local_488);
    std::unique_ptr<lf::geometry::TriaO1,_std::default_delete<lf::geometry::TriaO1>_>::~unique_ptr
              ((unique_ptr<lf::geometry::TriaO1,_std::default_delete<lf::geometry::TriaO1>_> *)
               local_490);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_460);
    std::allocator<unsigned_int>::~allocator(&local_47d);
    local_4b8 = 0.0;
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator<<
              (&local_4b0,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_3d8,
               &local_4b8);
    local_4c0 = 0.5;
    pCVar10 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                        (&local_4b0,&local_4c0);
    local_4c8 = 0.0;
    pCVar10 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                        (pCVar10,&local_4c8);
    local_4d0 = 0.0;
    pCVar10 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                        (pCVar10,&local_4d0);
    local_4d8 = 1.0;
    pCVar10 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                        (pCVar10,&local_4d8);
    local_4e0 = 1.0;
    Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
              (pCVar10,&local_4e0);
    Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::~CommaInitializer
              (&local_4b0);
    local_4e1 = lf::base::RefEl::kTria();
    local_52c[0] = 0;
    local_52c[1] = 4;
    local_52c[2] = 5;
    local_520 = local_52c;
    local_518 = 3;
    std::allocator<unsigned_int>::allocator(&local_52d);
    __l_00._M_len = local_518;
    __l_00._M_array = local_520;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_510,__l_00,&local_52d);
    std::span<const_unsigned_int,_18446744073709551615UL>::
    span<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>(&local_4f8,&local_510);
    std::make_unique<lf::geometry::TriaO1,Eigen::Matrix<double,_1,_1,0,_1,_1>&>
              ((Matrix<double,__1,__1,_0,__1,__1> *)local_540);
    std::unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>::
    unique_ptr<lf::geometry::TriaO1,std::default_delete<lf::geometry::TriaO1>,void>
              ((unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>> *)
               &local_538,
               (unique_ptr<lf::geometry::TriaO1,_std::default_delete<lf::geometry::TriaO1>_> *)
               local_540);
    lf::mesh::hybrid2d::MeshFactory::AddEntity
              ((MeshFactory *)local_2a8,local_4e1,&local_4f8,&local_538);
    std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>::
    ~unique_ptr(&local_538);
    std::unique_ptr<lf::geometry::TriaO1,_std::default_delete<lf::geometry::TriaO1>_>::~unique_ptr
              ((unique_ptr<lf::geometry::TriaO1,_std::default_delete<lf::geometry::TriaO1>_> *)
               local_540);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_510);
    std::allocator<unsigned_int>::~allocator(&local_52d);
    local_560[1] = 2;
    local_560[0] = 4;
    Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<int,int>
              ((Matrix<double,_1,_1,0,_1,_1> *)&local_558,local_560 + 1,local_560);
    Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::operator=
              ((Matrix<double,__1,__1,_0,__1,__1> *)local_3d8,&local_558);
    Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix(&local_558);
    local_588 = 0.5;
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator<<
              (&local_580,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_3d8,
               &local_588);
    local_590 = 1.0;
    pCVar10 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                        (&local_580,&local_590);
    local_598 = 1.0;
    pCVar10 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                        (pCVar10,&local_598);
    local_5a0 = 0.5;
    pCVar10 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                        (pCVar10,&local_5a0);
    local_5a8 = 0.0;
    pCVar10 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                        (pCVar10,&local_5a8);
    local_5b0 = 0.0;
    pCVar10 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                        (pCVar10,&local_5b0);
    local_5b8 = 1.0;
    pCVar10 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                        (pCVar10,&local_5b8);
    local_5c0 = 1.0;
    Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
              (pCVar10,&local_5c0);
    Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::~CommaInitializer
              (&local_580);
    local_5c1 = lf::base::RefEl::kQuad();
    local_610.first._M_elems[0] = 1;
    local_610.first._M_elems[1] = 2;
    local_610.second._M_t.
    super___uniq_ptr_impl<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>._M_t
    .super__Tuple_impl<0UL,_lf::geometry::Geometry_*,_std::default_delete<lf::geometry::Geometry>_>.
    super__Head_base<0UL,_lf::geometry::Geometry_*,_false>._M_head_impl._0_4_ = 3;
    local_610.second._M_t.
    super___uniq_ptr_impl<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>._M_t
    .super__Tuple_impl<0UL,_lf::geometry::Geometry_*,_std::default_delete<lf::geometry::Geometry>_>.
    super__Head_base<0UL,_lf::geometry::Geometry_*,_false>._M_head_impl._4_4_ = 4;
    local_600 = &local_610;
    local_5f8 = (pointer)0x4;
    std::allocator<unsigned_int>::allocator(&local_611);
    __l._M_len = (size_type)local_5f8;
    __l._M_array = (iterator)local_600;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_5f0,__l,&local_611);
    std::span<const_unsigned_int,_18446744073709551615UL>::
    span<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>(&local_5d8,&local_5f0);
    std::make_unique<lf::geometry::QuadO1,Eigen::Matrix<double,_1,_1,0,_1,_1>&>
              ((Matrix<double,__1,__1,_0,__1,__1> *)
               &base_mesh.super___shared_ptr<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount
              );
    std::unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>::
    unique_ptr<lf::geometry::QuadO1,std::default_delete<lf::geometry::QuadO1>,void>
              ((unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>> *)
               &local_620,
               (unique_ptr<lf::geometry::QuadO1,_std::default_delete<lf::geometry::QuadO1>_> *)
               &base_mesh.super___shared_ptr<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount
              );
    lf::mesh::hybrid2d::MeshFactory::AddEntity
              ((MeshFactory *)local_2a8,local_5c1,&local_5d8,&local_620);
    std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>::
    ~unique_ptr(&local_620);
    std::unique_ptr<lf::geometry::QuadO1,_std::default_delete<lf::geometry::QuadO1>_>::~unique_ptr
              ((unique_ptr<lf::geometry::QuadO1,_std::default_delete<lf::geometry::QuadO1>_> *)
               &base_mesh.super___shared_ptr<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount
              );
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_5f0);
    std::allocator<unsigned_int>::~allocator(&local_611);
    lf::mesh::hybrid2d::MeshFactory::Build((MeshFactory *)&pi);
    f.pi = (type *)boost::math::constants::pi<double>();
    std::shared_ptr<lf::mesh::Mesh>::shared_ptr
              ((shared_ptr<lf::mesh::Mesh> *)
               &errors.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                m_rows,(shared_ptr<lf::mesh::Mesh> *)&pi);
    vtk_writer.aux_node_offset_._M_elems[1]._52_4_ = local_1f4 + 1;
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<int>
              ((Matrix<double,__1,_1,_0,__1,_1> *)&level,
               (int *)&vtk_writer.aux_node_offset_._M_elems[1].field_0x34);
    for (vtk_writer.aux_node_offset_._M_elems[1].codim_ = 0;
        (int)vtk_writer.aux_node_offset_._M_elems[1].codim_ <= local_1f4;
        vtk_writer.aux_node_offset_._M_elems[1].codim_ =
             vtk_writer.aux_node_offset_._M_elems[1].codim_ + 1) {
      std::shared_ptr<lf::mesh::Mesh_const>::shared_ptr<lf::mesh::Mesh,void>
                ((shared_ptr<lf::mesh::Mesh_const> *)&local_860,
                 (shared_ptr<lf::mesh::Mesh> *)
                 &errors.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                  m_rows);
      std::__cxx11::to_string((string *)&approx,vtk_writer.aux_node_offset_._M_elems[1].codim_);
      std::operator+(&local_8a0,"level",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&approx);
      std::operator+(&local_880,&local_8a0,".vtk");
      lf::io::VtkWriter::VtkWriter((VtkWriter *)local_850,&local_860,&local_880,0,'\x01');
      std::__cxx11::string::~string((string *)&local_880);
      std::__cxx11::string::~string((string *)&local_8a0);
      std::__cxx11::string::~string((string *)&approx);
      std::shared_ptr<const_lf::mesh::Mesh>::~shared_ptr(&local_860);
      mesh_00 = std::__shared_ptr_access<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator*((__shared_ptr_access<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&errors.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                              m_storage.m_rows);
      mh.refinement_edges_.
      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)&f;
      integrate<main::__0>(mesh_00,local_220,(anon_class_8_1_3fcf66b7)&f);
      std::abs((int)mesh_00);
      pSVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                          ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&level,
                           (long)(int)vtk_writer.aux_node_offset_._M_elems[1].codim_);
      *pSVar11 = (Scalar)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
      std::make_unique<lf::mesh::hybrid2d::MeshFactory,int>((int *)&local_998);
      std::unique_ptr<lf::mesh::MeshFactory,std::default_delete<lf::mesh::MeshFactory>>::
      unique_ptr<lf::mesh::hybrid2d::MeshFactory,std::default_delete<lf::mesh::hybrid2d::MeshFactory>,void>
                ((unique_ptr<lf::mesh::MeshFactory,std::default_delete<lf::mesh::MeshFactory>> *)
                 &local_990,&local_998);
      lf::refinement::MeshHierarchy::MeshHierarchy
                ((MeshHierarchy *)local_988,
                 (shared_ptr<lf::mesh::Mesh> *)
                 &errors.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                  m_rows,&local_990);
      std::unique_ptr<lf::mesh::MeshFactory,_std::default_delete<lf::mesh::MeshFactory>_>::
      ~unique_ptr(&local_990);
      std::
      unique_ptr<lf::mesh::hybrid2d::MeshFactory,_std::default_delete<lf::mesh::hybrid2d::MeshFactory>_>
      ::~unique_ptr(&local_998);
      lf::refinement::MeshHierarchy::RefineRegular((MeshHierarchy *)local_988,rp_regular);
      lf::refinement::MeshHierarchy::getMesh
                ((MeshHierarchy *)
                 &A.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                  m_cols,(size_type)local_988);
      std::shared_ptr<lf::mesh::Mesh>::operator=
                ((shared_ptr<lf::mesh::Mesh> *)
                 &errors.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                  m_rows,(shared_ptr<lf::mesh::Mesh> *)
                         &A.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                          m_storage.m_cols);
      std::shared_ptr<lf::mesh::Mesh>::~shared_ptr
                ((shared_ptr<lf::mesh::Mesh> *)
                 &A.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                  m_cols);
      lf::refinement::MeshHierarchy::~MeshHierarchy((MeshHierarchy *)local_988);
      lf::io::VtkWriter::~VtkWriter((VtkWriter *)local_850);
    }
    poVar6 = std::operator<<((ostream *)&std::cout,"measured errors for each level: ");
    std::operator<<(poVar6,'\n');
    poVar6 = Eigen::operator<<((ostream *)&std::cout,
                               (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&level);
    poVar6 = std::operator<<(poVar6,'\n');
    std::operator<<(poVar6,'\n');
    local_9cc = local_1f4 + 1;
    local_9d0 = 2;
    Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<int,int>
              ((Matrix<double,_1,_1,0,_1,_1> *)local_9c8,&local_9cc,&local_9d0);
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::col
              (&local_a08,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_9c8,0);
    Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>_>::setOnes
              ((DenseBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_> *)
               &local_a08);
    local_b70 = 1.0;
    local_b78 = (double)(local_1f4 + 1);
    Eigen::DenseBase<Eigen::Array<double,_-1,_1,_0,_-1,_1>_>::LinSpaced
              (&local_b68,(long)(local_1f4 + 1),&local_b70,&local_b78);
    Eigen::
    DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::linspaced_op<double>,_Eigen::Array<double,_-1,_1,_0,_-1,_1>_>_>
    ::operator-(&local_b30,
                (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::linspaced_op<double>,_Eigen::Array<double,__1,_1,_0,__1,_1>_>_>
                 *)&local_b68);
    local_b80 = std::log<int>(2);
    Eigen::
    ArrayBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::CwiseNullaryOp<Eigen::internal::linspaced_op<double>,Eigen::Array<double,-1,1,0,-1,1>>const>>
    ::operator*(&local_ae8,
                (ArrayBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::CwiseNullaryOp<Eigen::internal::linspaced_op<double>,Eigen::Array<double,_1,1,0,_1,1>>const>>
                 *)&local_b30,&local_b80);
    Eigen::
    ArrayBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::linspaced_op<double>,_Eigen::Array<double,_-1,_1,_0,_-1,_1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_-1,_1,_0,_-1,_1>_>_>_>
    ::matrix(&local_a78,
             (ArrayBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::linspaced_op<double>,_Eigen::Array<double,__1,_1,_0,__1,_1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,__1,_1,_0,__1,_1>_>_>_>
              *)&local_ae8);
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::col
              ((ColXpr *)
               &b.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows,
               (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_9c8,1);
    Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,1,true>::operator=
              ((Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true> *)
               &b.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows,
               (DenseBase<Eigen::MatrixWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::linspaced_op<double>,_Eigen::Array<double,__1,_1,_0,__1,_1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,__1,_1,_0,__1,_1>_>_>_>_>
                *)&local_a78);
    local_bf8 = (non_const_type)
                Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::transpose
                          ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&level);
    local_bf0.m_matrix =
         (non_const_type)
         Eigen::MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>::array
                   ((MatrixBase<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_> *)
                    &local_bf8);
    Eigen::
    ArrayBase<Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>_>::log
              (local_be8,(double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00));
    Eigen::
    ArrayBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_log_op<double>,_const_Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>_>_>
    ::matrix(&local_bd8,
             (ArrayBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_log_op<double>,_const_Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>_>
              *)local_be8);
    Eigen::Matrix<double,-1,1,0,-1,1>::
    Matrix<Eigen::MatrixWrapper<Eigen::CwiseUnaryOp<Eigen::internal::scalar_log_op<double>,Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Matrix<double,_1,1,0,_1,1>>>const>const>>
              ((Matrix<double,_1,1,0,_1,1> *)local_bc8,
               (EigenBase<Eigen::MatrixWrapper<const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_log_op<double>,_const_Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>_>_>
                *)&local_bd8);
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::bottomRows<int>
              (&local_c30,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_9c8,3);
    Eigen::Matrix<double,-1,-1,0,-1,-1>::operator=
              ((Matrix<double,_1,_1,0,_1,_1> *)local_9c8,
               (DenseBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>_> *)
               &local_c30);
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::bottomRows<int>
              ((Type *)&x.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                        m_rows,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_bc8,3);
    Eigen::Matrix<double,-1,1,0,-1,1>::operator=
              ((Matrix<double,_1,1,0,_1,1> *)local_bc8,
               (DenseBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_> *)
               &x.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows);
    Eigen::MatrixBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::bdcSvd
              (&local_d80,(MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_9c8,0x28);
    local_c88 = Eigen::
                SolverBase<Eigen::SVDBase<Eigen::BDCSVD<Eigen::Matrix<double,-1,-1,0,-1,-1>>>>::
                solve<Eigen::Matrix<double,_1,1,0,_1,1>>
                          ((SolverBase<Eigen::SVDBase<Eigen::BDCSVD<Eigen::Matrix<double,_1,_1,0,_1,_1>>>>
                            *)&local_d80,
                           (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_bc8);
    Eigen::Matrix<double,-1,1,0,-1,1>::
    Matrix<Eigen::Solve<Eigen::SVDBase<Eigen::BDCSVD<Eigen::Matrix<double,_1,_1,0,_1,_1>>>,Eigen::Matrix<double,_1,1,0,_1,1>>>
              ((Matrix<double,_1,1,0,_1,1> *)local_c78,
               (EigenBase<Eigen::Solve<Eigen::SVDBase<Eigen::BDCSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                *)&local_c88);
    Eigen::BDCSVD<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::~BDCSVD(&local_d80);
    poVar6 = std::operator<<((ostream *)&std::cout,"estimated order of convergence = ");
    pSVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)local_c78,1);
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,*pSVar11);
    std::operator<<(poVar6,'\n');
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)local_c78);
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)local_bc8);
    Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix
              ((Matrix<double,__1,__1,_0,__1,__1> *)local_9c8);
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)&level);
    std::shared_ptr<lf::mesh::Mesh>::~shared_ptr
              ((shared_ptr<lf::mesh::Mesh> *)
               &errors.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                m_rows);
    std::shared_ptr<lf::mesh::Mesh>::~shared_ptr((shared_ptr<lf::mesh::Mesh> *)&pi);
    Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix
              ((Matrix<double,__1,__1,_0,__1,__1> *)local_3d8);
    lf::mesh::hybrid2d::MeshFactory::~MeshFactory((MeshFactory *)local_2a8);
    local_1f0 = 0;
  }
  else {
    poVar6 = boost::program_options::operator<<
                       ((ostream *)&std::cout,(options_description *)local_98);
    std::operator<<(poVar6,'\n');
    argv_local._4_4_ = 1;
    local_1f0 = 1;
  }
  boost::program_options::variables_map::~variables_map((variables_map *)local_180);
  boost::program_options::options_description::~options_description((options_description *)local_98)
  ;
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char** argv) {
  // define allowed command line arguments:
  namespace po = boost::program_options;
  po::options_description desc("Allowed options");
  // clang-format off
  desc.add_options()
  ("help", "produce this help message")
  ("quad_degree", po::value<int>()->default_value(3), "The degree of the local quadrature rule.")
  ("max_level", po::value<int>()->default_value(5), "The number of refinement levels")
  ;
  // clang-format on
  po::variables_map vm;
  po::store(po::parse_command_line(argc, argv, desc), vm);
  po::notify(vm);
  if (vm.count("help") != 0U) {
    std::cout << desc << '\n';
    return 1;
  }

  const int max_level = vm["max_level"].as<int>();
  const int quad_degree = vm["quad_degree"].as<int>();

  // Create a three element mesh that contains two triangles and one
  // quadrilateral
  lf::mesh::hybrid2d::MeshFactory mesh_factory(2);
  mesh_factory.AddPoint(Eigen::Vector2d{0, 0});
  mesh_factory.AddPoint(Eigen::Vector2d{0.5, 0});
  mesh_factory.AddPoint(Eigen::Vector2d{1, 0});
  mesh_factory.AddPoint(Eigen::Vector2d{1, 1});
  mesh_factory.AddPoint(Eigen::Vector2d{0.5, 1});
  mesh_factory.AddPoint(Eigen::Vector2d{0, 1});
  Eigen::MatrixXd node_coords(2, 3);
  node_coords << 0, 0.5, 0.5, 0, 0, 1;
  mesh_factory.AddEntity(lf::base::RefEl::kTria(),
                         std::vector<lf::base::size_type>{0, 1, 4},
                         std::make_unique<lf::geometry::TriaO1>(node_coords));
  node_coords << 0, 0.5, 0, 0, 1, 1;
  mesh_factory.AddEntity(lf::base::RefEl::kTria(),
                         std::vector<lf::base::size_type>{0, 4, 5},
                         std::make_unique<lf::geometry::TriaO1>(node_coords));
  node_coords = Eigen::MatrixXd(2, 4);
  node_coords << 0.5, 1, 1, 0.5, 0, 0, 1, 1;
  mesh_factory.AddEntity(lf::base::RefEl::kQuad(),
                         std::vector<lf::base::size_type>{1, 2, 3, 4},
                         std::make_unique<lf::geometry::QuadO1>(node_coords));

  auto base_mesh = mesh_factory.Build();

  // parameters:
  auto pi = boost::math::constants::pi<double>();
  auto f = [&](const Eigen::Vector2d& x) {
    return std::sin(pi * x(0)) * std::pow(std::cos(pi * x(1)), 2);
  };
  auto exact_integral = 1. / pi;

  auto mesh = base_mesh;
  auto errors = Eigen::VectorXd(max_level + 1);
  for (int level = 0; level <= max_level; ++level) {
    const lf::io::VtkWriter vtk_writer(
        mesh, "level" + std::to_string(level) + ".vtk");

    auto approx = integrate(*mesh, quad_degree, f);
    errors(level) = std::abs(approx - exact_integral);

    lf::refinement::MeshHierarchy mh(
        mesh, std::make_unique<lf::mesh::hybrid2d::MeshFactory>(2));
    mh.RefineRegular();
    mesh = mh.getMesh(1);
  }

  std::cout << "measured errors for each level: " << '\n';
  std::cout << errors << '\n' << '\n';

  // estimate the rate of convergence:
  Eigen::MatrixXd A(max_level + 1, 2);
  A.col(0).setOnes();
  A.col(1) = (-Eigen::ArrayXd::LinSpaced(max_level + 1, 1, max_level + 1) *
              std::log(2))
                 .matrix();

  Eigen::VectorXd b = errors.transpose().array().log().matrix();

  // consider only the three smallest meshes:
  A = A.bottomRows(3);
  b = b.bottomRows(3);

  Eigen::VectorXd x =
      A.bdcSvd(Eigen::ComputeThinU | Eigen::ComputeThinV).solve(b);
  std::cout << "estimated order of convergence = " << x(1) << '\n';
}